

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O3

void __thiscall iqxmlrpc::Pool_executor_factory::add_threads(Pool_executor_factory *this,uint num)

{
  pointer *pppPVar1;
  iterator __position;
  Pool_thread *in_RAX;
  uint uVar2;
  Pool_thread threadfunc;
  Pool_thread *t;
  Pool_thread *local_38;
  
  if (num != 0) {
    uVar2 = 0;
    local_38 = in_RAX;
    do {
      local_38 = (Pool_thread *)operator_new(0x10);
      local_38->id = uVar2;
      local_38->pool = this;
      __position._M_current =
           (this->pool).
           super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->pool).
          super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<iqxmlrpc::Pool_executor_factory::Pool_thread*,std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread*>>
        ::_M_realloc_insert<iqxmlrpc::Pool_executor_factory::Pool_thread*const&>
                  ((vector<iqxmlrpc::Pool_executor_factory::Pool_thread*,std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread*>>
                    *)&this->pool,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppPVar1 = &(this->pool).
                    super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      threadfunc._4_4_ = 0;
      threadfunc.id = local_38->id;
      threadfunc.pool = local_38->pool;
      boost::thread_group::create_thread<iqxmlrpc::Pool_executor_factory::Pool_thread>
                (&this->threads,threadfunc);
      uVar2 = uVar2 + 1;
    } while (num != uVar2);
  }
  return;
}

Assistant:

void Pool_executor_factory::add_threads( unsigned num )
{
  for( unsigned i = 0; i < num; ++i )
  {
    Pool_thread* t = new Pool_thread(i, this);
    pool.push_back(t);
    threads.create_thread(*t);
  }
}